

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O2

SourceBase * __thiscall
COLLADASaxFWL::MeshLoader::getSourceByInputSemanticFromVertices(MeshLoader *this,Semantic *semantic)

{
  InputUnshared *pIVar1;
  SourceBase *pSVar2;
  String sourceId;
  URI positionsInputSource;
  String local_110;
  undefined1 local_f0 [232];
  
  pIVar1 = Vertices::getInputBySemantic(&this->mVerticesInputs,semantic);
  if (pIVar1 == (InputUnshared *)0x0) {
    pSVar2 = (SourceBase *)0x0;
  }
  else {
    COLLADABU::URI::URI((URI *)local_f0,&pIVar1->mSource,false);
    std::__cxx11::string::string((string *)&local_110,(string *)(local_f0 + 0xc0));
    pSVar2 = SourceArrayLoader::getSourceById(&this->super_SourceArrayLoader,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    COLLADABU::URI::~URI((URI *)local_f0);
  }
  return pSVar2;
}

Assistant:

const SourceBase* MeshLoader::getSourceByInputSemanticFromVertices ( const InputSemantic::Semantic& semantic ) const
    {
        // Check if the input element with the semantic is a vertex element.
        const InputUnshared* positionsInput = getVertexInputBySemantic ( semantic );
        if ( positionsInput == 0 ) return 0;

        // Get the source element with the uri of the input element.
        COLLADABU::URI positionsInputSource = positionsInput->getSource ();
        String sourceId = positionsInputSource.getFragment ();

        return getSourceById ( sourceId );
    }